

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlkq.cpp
# Opt level: O3

void __thiscall pg::ZLKQSolver::solve(ZLKQSolver *this,bitset *SG,int vtop,int pe,int po)

{
  ulong *puVar1;
  uint uVar2;
  uint64_t *puVar3;
  uint *puVar4;
  Game *pGVar5;
  int *piVar6;
  char cVar7;
  int iVar8;
  ostream *poVar9;
  long *plVar10;
  size_t sVar11;
  uint64_t *puVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  size_t sVar17;
  uint uVar18;
  int *piVar19;
  uint uVar20;
  bitset *pbVar21;
  uint uVar22;
  int iVar23;
  ulong uVar24;
  long lVar25;
  bool bVar26;
  bitset H;
  bool local_b0;
  _label_vertex local_a0;
  uint local_90;
  uint local_8c;
  bitset *local_88;
  bitset *local_80;
  bitset local_78;
  bitset local_58;
  ulong local_38;
  
  this->iterations = this->iterations + 1;
  uVar16 = (ulong)(uint)vtop;
  if (po < 1) {
    sVar11 = (this->W0)._bitssize;
    if (sVar11 != 0) {
      puVar12 = (this->W0)._bits;
      sVar17 = 0;
      puVar3 = SG->_bits;
      do {
        puVar1 = puVar12 + sVar17;
        *puVar1 = *puVar1 | puVar3[sVar17];
        sVar17 = sVar17 + 1;
      } while (sVar11 != sVar17);
    }
    if ((this->super_Solver).trace == 0) {
      return;
    }
    sVar11 = 0;
    do {
      if (SG->_bitssize == sVar11) {
        return;
      }
      puVar12 = SG->_bits + sVar11;
      sVar11 = sVar11 + 1;
    } while (*puVar12 == 0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->super_Solver).logger,"End of precision; presumed won by player 0:",0x2b);
    if (-1 < vtop) {
      do {
        if ((SG->_bits[uVar16 >> 6] >> (uVar16 & 0x3f) & 1) != 0) {
          poVar9 = (this->super_Solver).logger;
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," \x1b[38;5;38m",0xb);
          local_78._bits = (uint64_t *)(this->super_Solver).game;
          local_78._size = CONCAT44(local_78._size._4_4_,(int)uVar16);
          poVar9 = operator<<(poVar9,(_label_vertex *)&local_78);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[m",3);
        }
        bVar26 = 0 < (long)uVar16;
        uVar16 = uVar16 - 1;
      } while (bVar26);
    }
  }
  else {
    if (0 < pe) {
      if (vtop < 0) {
        if (vtop == -1) {
          return;
        }
      }
      else {
        while (iVar23 = (int)uVar16, (SG->_bits[uVar16 >> 6] >> (uVar16 & 0x3f) & 1) == 0) {
          uVar16 = (ulong)(iVar23 - 1);
          if (iVar23 < 1) {
            return;
          }
        }
      }
      iVar23 = (int)uVar16;
      uVar2 = ((this->super_Solver).game)->_priority[iVar23];
      if ((uVar2 & 1) == 0) {
        uVar22 = pe;
        uVar18 = (uint)po >> 1;
      }
      else {
        uVar22 = (uint)pe >> 1;
        uVar18 = po;
      }
      solve(this,SG,iVar23,uVar22,uVar18);
      uVar22 = uVar2 & 1;
      if (1 < (this->super_Solver).trace) {
        poVar9 = (this->super_Solver).logger;
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"in pr=",6);
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,uVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,", pe=",5);
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,pe);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,", po=",5);
        plVar10 = (long *)std::ostream::operator<<(poVar9,po);
        std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
        std::ostream::put((char)plVar10);
        std::ostream::flush();
      }
      sVar11 = bitset::count(SG);
      uVar18 = pe;
      if (uVar22 == 0) {
        uVar18 = po;
      }
      if (sVar11 <= uVar18 >> 1) {
        return;
      }
      local_80 = &this->W0;
      local_88 = &this->W1;
      if (uVar22 == 0) {
        local_80 = &this->W1;
        local_88 = &this->W0;
      }
      uVar24 = SG->_bitssize;
      local_78._size = SG->_size;
      local_78._bitssize = SG->_bitssize;
      uVar14 = uVar24 * 8;
      local_90 = po;
      local_78._allocsize = uVar14;
      puVar12 = (uint64_t *)operator_new__(-(ulong)(uVar24 >> 0x3d != 0) | uVar14);
      local_78._bits = puVar12;
      if (uVar24 != 0) {
        memmove(puVar12,SG->_bits,uVar14);
        uVar14 = 0;
        puVar3 = local_88->_bits;
        do {
          puVar12[uVar14] = puVar12[uVar14] & puVar3[uVar14];
          uVar14 = uVar14 + 1;
        } while (uVar24 != uVar14);
      }
      if (iVar23 < 0) {
        if (iVar23 != -1) {
LAB_00154fcf:
          iVar23 = (int)uVar16;
          local_58._size = ((this->super_Solver).game)->n_vertices;
          uVar14 = local_58._size + 0x3f;
          local_58._bitssize = uVar14 >> 6;
          uVar24 = local_58._bitssize << 3;
          local_58._allocsize = uVar24;
          local_58._bits = (uint64_t *)operator_new__(uVar24);
          local_38 = (ulong)(uVar22 << 5);
          if (0x3f < uVar14) {
            memset(local_58._bits,0,uVar24);
          }
          local_38 = local_38 + 0x50;
          uVar14 = (ulong)iVar23;
          do {
            if ((((this->super_Solver).game)->_priority[uVar14] & 1U) != uVar22) break;
            if ((local_78._bits[uVar14 >> 6] >> (uVar14 & 0x3f) & 1) != 0) {
              local_58._bits[uVar14 >> 6] = local_58._bits[uVar14 >> 6] | 1L << (uVar14 & 0x3f);
              this->str[uVar14] = -1;
              iVar8 = (this->Q).pointer;
              (this->Q).pointer = iVar8 + 1;
              (this->Q).queue[iVar8] = (uint)uVar14;
              while( true ) {
                iVar8 = (this->Q).pointer;
                if ((long)iVar8 == 0) break;
                (this->Q).pointer = iVar8 + -1;
                attractVertices(this,uVar22,(this->Q).queue[(long)iVar8 + -1],&local_58,&local_78,
                                &local_78);
              }
            }
            bVar26 = uVar14 != 0;
            uVar14 = uVar14 - 1;
          } while (bVar26);
          pbVar21 = local_88;
          uVar18 = local_90;
          if ((this->super_Solver).trace != 0) {
            poVar9 = (this->super_Solver).logger;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar9,"\x1b[1;33mregion \x1b[36m",0x13);
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,uVar2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[m",3);
            if (local_58._bitssize != 0) {
              lVar13 = local_58._bitssize * -0x40;
              sVar11 = local_58._bitssize;
              do {
                lVar13 = lVar13 + 0x40;
                if (local_58._bits[sVar11 - 1] != 0) {
                  lVar25 = LZCOUNT(local_58._bits[sVar11 - 1]);
                  if (lVar13 - lVar25 != 0x40) {
                    sVar11 = lVar25 - lVar13 ^ 0x3f;
                    do {
                      poVar9 = (this->super_Solver).logger;
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar9," \x1b[38;5;38m",0xb);
                      local_a0.g = (this->super_Solver).game;
                      local_a0.v = (int)sVar11;
                      poVar9 = operator<<(poVar9,&local_a0);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[m",3);
                      sVar11 = bitset::find_prev(&local_58,sVar11);
                      pbVar21 = local_88;
                    } while (sVar11 != 0xffffffffffffffff);
                  }
                  break;
                }
                sVar11 = sVar11 - 1;
              } while (sVar11 != 0);
            }
            poVar9 = (this->super_Solver).logger;
            cVar7 = (char)poVar9;
            std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + cVar7);
            uVar18 = local_90;
            std::ostream::put(cVar7);
            std::ostream::flush();
          }
          sVar11 = local_80->_bitssize;
          if (sVar11 != 0) {
            sVar17 = 0;
            puVar12 = local_80->_bits;
            do {
              puVar12[sVar17] = puVar12[sVar17] & ~local_78._bits[sVar17];
              sVar17 = sVar17 + 1;
            } while (sVar11 != sVar17);
          }
          sVar11 = pbVar21->_bitssize;
          if (sVar11 != 0) {
            puVar12 = pbVar21->_bits;
            sVar17 = 0;
            do {
              puVar1 = puVar12 + sVar17;
              *puVar1 = *puVar1 & ~local_78._bits[sVar17];
              sVar17 = sVar17 + 1;
            } while (sVar11 != sVar17);
            sVar11 = pbVar21->_bitssize;
            if (sVar11 != 0) {
              sVar17 = 0;
              do {
                puVar1 = puVar12 + sVar17;
                *puVar1 = *puVar1 | local_58._bits[sVar17];
                sVar17 = sVar17 + 1;
              } while (sVar11 != sVar17);
            }
          }
          if (local_58._bitssize != 0) {
            uVar14 = 0;
            do {
              local_58._bits[uVar14] = local_58._bits[uVar14] ^ local_78._bits[uVar14];
              uVar14 = uVar14 + 1;
            } while (local_58._bitssize != uVar14);
          }
          solve(this,&local_58,iVar23,pe,uVar18);
          if (-1 < iVar23) {
            puVar4 = (this->Q).queue;
            uVar14 = 0;
            do {
              if (((local_58._bits[uVar14 >> 6] >> (uVar14 & 0x3f) & 1) != 0) &&
                 ((local_80->_bits[uVar14 >> 6] & 1L << (uVar14 & 0x3f)) != 0)) {
                iVar8 = (this->Q).pointer;
                (this->Q).pointer = iVar8 + 1;
                puVar4[iVar8] = (uint)uVar14;
              }
              uVar14 = uVar14 + 1;
            } while (iVar23 + 1 != uVar14);
          }
          iVar8 = (this->Q).pointer;
          if (iVar8 == 0) {
            local_8c = 0;
          }
          else {
            local_8c = 0;
            do {
              (this->Q).pointer = iVar8 + -1;
              uVar20 = (this->Q).queue[(long)iVar8 + -1];
              uVar24 = (ulong)(int)uVar20;
              uVar14 = *(ulong *)(*(long *)((long)&(this->super_Solver)._vptr_Solver + local_38) +
                                 (uVar24 >> 6) * 8);
              if ((((uVar14 >> (uVar24 & 0x3f) & 1) != 0) &&
                  (local_8c = (uint)CONCAT71((int7)(uVar14 >> 8),1), (this->super_Solver).trace != 0
                  )) && (((this->super_Solver).game)->_priority[uVar24] == uVar2)) {
                poVar9 = (this->super_Solver).logger;
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar9,"\x1b[1;37mfound distraction\x1b[m: ",0x1d);
                local_a0.g = (this->super_Solver).game;
                local_a0.v = uVar20;
                poVar9 = operator<<(poVar9,&local_a0);
                std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
                std::ostream::put((char)poVar9);
                std::ostream::flush();
              }
              attractVertices(this,uVar22 ^ 1,uVar20,local_80,&local_78,&local_78);
              iVar8 = (this->Q).pointer;
              pbVar21 = local_88;
            } while (iVar8 != 0);
          }
          uVar18 = local_90;
          if (1 < (this->super_Solver).trace) {
            poVar9 = (this->super_Solver).logger;
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"Subgame of (",0xc);
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,uVar2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9," pe=",4);
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,pe);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9," po=",4);
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,uVar18);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"):",2);
            uVar14 = uVar16;
            if (-1 < iVar23) {
              do {
                uVar24 = uVar14 >> 6;
                if ((SG->_bits[uVar24] >> (uVar14 & 0x3f) & 1) != 0) {
                  uVar15 = 1L << (uVar14 & 0x3f);
                  uVar20 = (uint)uVar14;
                  if ((local_78._bits[uVar24] & uVar15) == 0) {
                    poVar9 = (this->super_Solver).logger;
                    std::__ostream_insert<char,std::char_traits<char>>(poVar9," \x1b[38;5;160m",0xc)
                    ;
                    local_a0.g = (this->super_Solver).game;
                    local_a0.v = uVar20;
                    poVar9 = operator<<(poVar9,&local_a0);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[m",3);
                  }
                  else if ((local_88->_bits[uVar24] & uVar15) == 0) {
                    poVar9 = (this->super_Solver).logger;
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar9," \x1b[1;38;5;196m",0xe);
                    local_a0.g = (this->super_Solver).game;
                    local_a0.v = uVar20;
                    poVar9 = operator<<(poVar9,&local_a0);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[m",3);
                  }
                  else if ((local_80->_bits[uVar24] & uVar15) == 0) {
                    poVar9 = (this->super_Solver).logger;
                    if ((local_58._bits[uVar24] & uVar15) == 0) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar9," \x1b[1;38;5;46m",0xd);
                      local_a0.g = (this->super_Solver).game;
                      local_a0.v = uVar20;
                      poVar9 = operator<<(poVar9,&local_a0);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[m",3);
                    }
                    else {
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar9," \x1b[38;5;38m",0xb);
                      local_a0.g = (this->super_Solver).game;
                      local_a0.v = uVar20;
                      poVar9 = operator<<(poVar9,&local_a0);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[m",3);
                    }
                  }
                  else {
                    poVar9 = (this->super_Solver).logger;
                    std::__ostream_insert<char,std::char_traits<char>>(poVar9," \x1b[38;5;202m",0xc)
                    ;
                    local_a0.g = (this->super_Solver).game;
                    local_a0.v = uVar20;
                    poVar9 = operator<<(poVar9,&local_a0);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[m",3);
                  }
                }
                bVar26 = 0 < (long)uVar14;
                uVar14 = uVar14 - 1;
              } while (bVar26);
            }
            poVar9 = (this->super_Solver).logger;
            cVar7 = (char)poVar9;
            std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + cVar7);
            pbVar21 = local_88;
            uVar18 = local_90;
            std::ostream::put(cVar7);
            std::ostream::flush();
          }
          if ((local_8c & 1) == 0) {
            if (-1 < iVar23) {
              pGVar5 = (this->super_Solver).game;
              piVar6 = this->str;
              local_b0 = (bool)((byte)uVar2 & 1);
              do {
                uVar14 = uVar16 >> 6;
                if ((local_78._bits[uVar14] >> (uVar16 & 0x3f) & 1) != 0) {
                  uVar24 = 1L << (uVar16 & 0x3f);
                  if ((((pbVar21->_bits[uVar14] & uVar24) != 0) &&
                      ((((pGVar5->_owner)._bits[uVar14] & uVar24) == 0) != local_b0)) &&
                     (piVar6[uVar16] == -1)) {
                    iVar23 = pGVar5->_outedges[pGVar5->_firstouts[uVar16]];
                    if (iVar23 != -1) {
                      piVar19 = pGVar5->_outedges + (long)pGVar5->_firstouts[uVar16] + 1;
                      do {
                        if ((pbVar21->_bits[(ulong)(long)iVar23 >> 6] >> ((long)iVar23 & 0x3fU) & 1)
                            != 0) {
                          piVar6[uVar16] = iVar23;
                          break;
                        }
                        iVar23 = *piVar19;
                        piVar19 = piVar19 + 1;
                      } while (iVar23 != -1);
                    }
                  }
                }
                bVar26 = 0 < (long)uVar16;
                uVar16 = uVar16 - 1;
              } while (bVar26);
            }
          }
          else {
            sVar11 = pbVar21->_bitssize;
            if (sVar11 != 0) {
              puVar12 = pbVar21->_bits;
              sVar17 = 0;
              do {
                puVar12[sVar17] = puVar12[sVar17] & ~local_78._bits[sVar17];
                sVar17 = sVar17 + 1;
              } while (sVar11 != sVar17);
            }
            if (local_78._bitssize != 0) {
              sVar11 = 0;
              puVar12 = local_80->_bits;
              do {
                local_78._bits[sVar11] = local_78._bits[sVar11] & ~puVar12[sVar11];
                sVar11 = sVar11 + 1;
              } while (local_78._bitssize != sVar11);
            }
            if (iVar23 < 0) {
              if (iVar23 != -1) {
LAB_001557f5:
                solve(this,&local_78,iVar23,(uint)pe >> uVar22,uVar18 >> ((byte)uVar22 ^ 1));
              }
            }
            else {
              do {
                iVar23 = (int)uVar16;
                if ((local_78._bits[uVar16 >> 6] >> (uVar16 & 0x3f) & 1) != 0) goto LAB_001557f5;
                uVar16 = (ulong)(iVar23 - 1);
              } while (0 < iVar23);
            }
          }
          if (local_58._bits != (uint64_t *)0x0) {
            operator_delete__(local_58._bits);
          }
          puVar12 = local_78._bits;
          if (local_78._bits == (uint64_t *)0x0) {
            return;
          }
        }
      }
      else {
        do {
          iVar23 = (int)uVar16;
          if ((puVar12[uVar16 >> 6] >> (uVar16 & 0x3f) & 1) != 0) goto LAB_00154fcf;
          uVar16 = (ulong)(iVar23 - 1);
        } while (0 < iVar23);
      }
      operator_delete__(puVar12);
      return;
    }
    sVar11 = (this->W1)._bitssize;
    if (sVar11 != 0) {
      puVar12 = (this->W1)._bits;
      sVar17 = 0;
      puVar3 = SG->_bits;
      do {
        puVar1 = puVar12 + sVar17;
        *puVar1 = *puVar1 | puVar3[sVar17];
        sVar17 = sVar17 + 1;
      } while (sVar11 != sVar17);
    }
    if ((this->super_Solver).trace == 0) {
      return;
    }
    sVar11 = 0;
    do {
      if (SG->_bitssize == sVar11) {
        return;
      }
      puVar12 = SG->_bits + sVar11;
      sVar11 = sVar11 + 1;
    } while (*puVar12 == 0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->super_Solver).logger,"End of precision; presumed won by player 1:",0x2b);
    if (-1 < vtop) {
      do {
        if ((SG->_bits[uVar16 >> 6] >> (uVar16 & 0x3f) & 1) != 0) {
          poVar9 = (this->super_Solver).logger;
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," \x1b[38;5;38m",0xb);
          local_78._bits = (uint64_t *)(this->super_Solver).game;
          local_78._size = CONCAT44(local_78._size._4_4_,(int)uVar16);
          poVar9 = operator<<(poVar9,(_label_vertex *)&local_78);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[m",3);
        }
        bVar26 = 0 < (long)uVar16;
        uVar16 = uVar16 - 1;
      } while (bVar26);
    }
  }
  poVar9 = (this->super_Solver).logger;
  cVar7 = (char)poVar9;
  std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + cVar7);
  std::ostream::put(cVar7);
  std::ostream::flush();
  return;
}

Assistant:

void
ZLKQSolver::solve(bitset &SG, int vtop, const int pe, const int po)
{
    /**
     * This is based on a universal tree of height pr/2, with parameter n associated with pe or po
     * We use several implementation tricks to make optimal use of memory and allocate as few as possible
     * For example, we record partial winning sets for Even and Odd in W0 and W1, because all partial
     * winning sets between calls are disjoint (so, safe to share the same bit array)
     */

    /**
     * Record the number of recursive calls (visits)
     */

    iterations++;

    /**
     * Check if we have run out of precision / nodes! (parameter n)
     * If our opponent's precision is gone, assume it's all won by us.
     * If our own precision is gone, assume it's all won by the opponent.
     */

    if (po <= 0) {
        W0 |= SG;

#ifndef NDEBUG
        if (trace and SG.any()) {
            logger << "End of precision; presumed won by player 0:";
            for (int v=vtop; v>=0; v--) {
                if (SG[v]) {
                    logger << " \033[38;5;38m" << label_vertex(v) << "\033[m";
                }
            }
            logger << std::endl;
        }
#endif

        return;
    }

    if (pe <= 0) {
        W1 |= SG;

#ifndef NDEBUG
        if (trace and SG.any()) {
            logger << "End of precision; presumed won by player 1:";
            for (int v=vtop; v>=0; v--) {
                if (SG[v]) {
                    logger << " \033[38;5;38m" << label_vertex(v) << "\033[m";
                }
            }
            logger << std::endl;
        }
#endif

        return;
    }

    /**
     * Move <vtop> to the true top (highest vertex that is in SG)
     */

    while (vtop >= 0 and !SG[vtop]) vtop--;

    /**
     * Check if the game is empty
     */
    if (vtop == -1) return; // empty game, bye

    /**
     * Optimization: set pr/pl to top priority/player
     * This is like taking a shortcut in the Tree
     */

    const int pr = priority(vtop);
    const int pl = pr&1;

    /**
     * Expand the left side of the current level of the universal tree
     */

    if (pl == 0) {
        solve(SG, vtop, pe, po/2);
    } else {
        solve(SG, vtop, pe/2, po);
    }

#ifndef NDEBUG
    if (trace >= 2) logger << "in pr=" << pr << ", pe=" << pe << ", po=" << po << std::endl;
#endif

    /**
     * If the remaining subgame size <= po/2 cq pe/2 then we don't need to continue after the recursion.
     *   (this optimization is due to Lehtinen, Parys, Schewe, Wojtczak '21)
     */

    if (pl == 0) {
        if (SG.count() <= (unsigned long)(po/2)) return;
    } else {
        if (SG.count() <= (unsigned long)(pe/2)) return;
    }

    auto &Wm = pl == 0 ? W0 : W1; // my W
    auto &Wo = pl == 0 ? W1 : W0; // opponent's W

    /**
     * Now compute <R> := vertices in subgame that we won in the left side
     * That is, the intersection of SG and Wm.
     *
     * Consider R to be the game that remains after the steps on the left in the universal tree.
     * Fmore, SG is immutable, R is a local bitset
     */

    bitset R(SG);
    R &= Wm;

    /**
     * Update vtop to the highest vertex in the intersection
     */
    while (vtop >= 0 and !R[vtop]) vtop--;
    if (vtop == -1) return;

    /**
     * Compute H := Attr(vertices of <pr> in <R>)
     */
    bitset H(nodecount());

    for (int v=vtop; v!=-1; v--) {
        // if (priority(v) != pr) break; // stop attracting ... ;) [todo: add otf compression ?]
        if ((priority(v)&1) != pl) break; // on-the-fly compression
        if (R[v]) {
            H[v] = true;
            str[v] = -1;
            Q.push(v);
            while (Q.nonempty()) {
                attractVertices(pl, Q.pop(), H, R, R);
            }
        }
    }

#ifndef NDEBUG
    if (trace) {
        logger << "\033[1;33mregion \033[36m" << pr << "\033[m";
        for (auto v = H.find_last(); v != bitset::npos; v = H.find_prev(v)) {
            logger << " \033[38;5;38m" << label_vertex(v) << "\033[m";
        }
        logger << std::endl;
    }
#endif

    /**
     * Reset Wo and Wm for vertices in <R> - <H>;
     * Set H to the remaining subgame (G' in the universal paper)
     */

    // reset opponent and our region
    Wo -= R;
    Wm -= R;
    // but set everything in H to ours
    Wm |= H;
    // and set H := R - H
    H ^= R;

    /**
     * Go recursive!
     */
    solve(H, vtop, pe, po);

    /**
     * Let the opponent attract from our region...
     * The intersection of H and Wo is the opponent's subgame
     */
    bool opponent_attracted_from_us = false;
    for (int v=0; v<=vtop; v++) {
        if (H[v] and Wo[v]) Q.push(v);
    }
    if (Q.nonempty()) {
        while (Q.nonempty()) {
            const int v = Q.pop();
            if (Wm[v]) {
#ifndef NDEBUG
                if (trace and priority(v) == pr) {
                    logger << "\033[1;37mfound distraction\033[m: " << label_vertex(v) << std::endl;
                }
#endif
                opponent_attracted_from_us = true;
            }
            attractVertices(1-pl, v, Wo, R, R);
        }
    }

#ifndef NDEBUG
    /**
     * If so desired, report our current status...
     */
    if (trace >= 2) {
        logger << "Subgame of (" << pr << " pe=" << pe << " po=" << po << "):";
        for (int v=vtop; v>=0; v--) {
            if (SG[v]) {
                if (R[v]) {
                    if (Wm[v]) {
                        if (Wo[v]) logger << " \033[38;5;202m" << label_vertex(v) << "\033[m";
                        else if (!H[v]) logger << " \033[1;38;5;46m" << label_vertex(v) << "\033[m";
                        else logger << " \033[38;5;38m" << label_vertex(v) << "\033[m";
                    }
                    else logger << " \033[1;38;5;196m" << label_vertex(v) << "\033[m";
                }
                else logger << " \033[38;5;160m" << label_vertex(v) << "\033[m";
            }
        }
        logger << std::endl;
    }
#endif

    /**
     * Finally, if the opponent attracted from us, then we do the right side
     * of the universal tree. Otherwise: update strategies and return.
     * Notice this is also an optimization.
     */
    if (opponent_attracted_from_us) {
        // Reset my winning region <Wm>
        Wm -= R;

        // Reduce subgame by removing opponent's winning region <Wo>
        R -= Wo;

        // Update vtop
        while (vtop >= 0 and !R[vtop]) vtop--;

        // Check if the game is empty
        if (vtop == -1) return; // empty game, bye

        // Expand the right side of the current level of the universal tree
        if (pl == 0) solve(R, vtop, pe, po/2);
        else solve(R, vtop, pe/2, po);
    } else {
        // Set strategy for vertices that do not yet have a strategy
        for (int v=vtop; v>=0; v--) {
            if (R[v] and Wm[v] and owner(v) == pl and str[v] == -1) {
                auto curedge = outs(v);
                for (int to = *curedge; to != -1; to = *++curedge) {
                    if (Wm[to]) {
                        str[v] = to;
                        break;
                    }
                }
            }
        }
    }
}